

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesContext::processFunction
          (RemoveUnusedInterfaceVariablesContext *this,Function *func)

{
  pointer puVar1;
  BasicBlock *pBVar2;
  pointer pOVar3;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var4;
  bool bVar5;
  char cVar6;
  pointer puVar7;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var8;
  Instruction *pIVar9;
  pointer pOVar10;
  RemoveUnusedInterfaceVariablesContext **local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  undefined8 local_58;
  RemoveUnusedInterfaceVariablesContext *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  puVar7 = (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    do {
      pBVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      for (pIVar9 = *(Instruction **)
                     ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10
                     );
          pIVar9 != (Instruction *)
                    ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
          pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        local_48 = 0;
        local_38 = std::
                   _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/remove_unused_interface_variables_pass.cpp:33:33)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/remove_unused_interface_variables_pass.cpp:33:33)>
                   ::_M_manager;
        local_70 = 0;
        local_78 = &local_50;
        local_60 = std::
                   _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:838:17)>
                   ::_M_invoke;
        local_68 = std::
                   _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:838:17)>
                   ::_M_manager;
        pOVar10 = *(pointer *)
                   &(pIVar9->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl;
        pOVar3 = *(pointer *)
                  ((long)&(pIVar9->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  + 8);
        local_50 = this;
        if (pOVar10 == pOVar3) {
LAB_004f1b12:
          (*local_68)(&local_78,&local_78,3);
        }
        else {
          do {
            bVar5 = spvIsInIdType(pOVar10->type);
            if (bVar5) {
              _Var4._M_head_impl =
                   *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    &(pOVar10->words).large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ;
              _Var8._M_head_impl =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &(pOVar10->words).small_data_;
              if ((tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )_Var4._M_head_impl !=
                  (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   )0x0) {
                _Var8._M_head_impl = _Var4._M_head_impl;
              }
              local_58 = *(undefined8 *)_Var8._M_head_impl;
              if (local_68 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              cVar6 = (*local_60)(&local_78,&local_58);
              if (cVar6 == '\0') break;
            }
            pOVar10 = pOVar10 + 1;
          } while (pOVar10 != pOVar3);
          if (local_68 != (code *)0x0) goto LAB_004f1b12;
        }
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,3);
        }
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  return false;
}

Assistant:

bool processFunction(Function* func) {
    for (const auto& basic_block : *func)
      for (const auto& instruction : basic_block)
        instruction.ForEachInId([&](const uint32_t* id) {
          if (used_variables_.count(*id)) return;
          auto* var = parent_.get_def_use_mgr()->GetDef(*id);
          if (!var || var->opcode() != spv::Op::OpVariable) return;
          auto storage_class =
              spv::StorageClass(var->GetSingleWordInOperand(0));
          if (storage_class != spv::StorageClass::Function &&
              (parent_.get_module()->version() >=
                   SPV_SPIRV_VERSION_WORD(1, 4) ||
               storage_class == spv::StorageClass::Input ||
               storage_class == spv::StorageClass::Output)) {
            used_variables_.insert(*id);
            operands_to_add_.push_back(*id);
          }
        });
    return false;
  }